

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_SimpleMessage_Test::TestBody
          (ParseMessageTest_SimpleMessage_Test *this)

{
  ParseMessageTest_SimpleMessage_Test *this_local;
  
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,"message TestMessage {\n  required int32 foo = 1;\n}\n",
             "message_type {  name: \"TestMessage\"  field { name:\"foo\" label:LABEL_REQUIRED type:TYPE_INT32 number:1 }}"
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, SimpleMessage) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  required int32 foo = 1;\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  field { name:\"foo\" label:LABEL_REQUIRED type:TYPE_INT32 number:1 }"
      "}");
}